

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QPodArrayOps<QHeaderViewPrivate::SectionItem>::erase
          (QPodArrayOps<QHeaderViewPrivate::SectionItem> *this,SectionItem *b,qsizetype n)

{
  SectionItem *__src;
  SectionItem *pSVar1;
  SectionItem *pSVar2;
  long lVar3;
  
  __src = b + n;
  pSVar2 = (this->super_QArrayDataPointer<QHeaderViewPrivate::SectionItem>).ptr;
  lVar3 = (this->super_QArrayDataPointer<QHeaderViewPrivate::SectionItem>).size;
  pSVar1 = pSVar2 + lVar3;
  if (__src == pSVar1 || pSVar2 != b) {
    if (__src != pSVar1) {
      memmove(b,__src,(long)pSVar1 - (long)__src);
      lVar3 = (this->super_QArrayDataPointer<QHeaderViewPrivate::SectionItem>).size;
    }
  }
  else {
    (this->super_QArrayDataPointer<QHeaderViewPrivate::SectionItem>).ptr = __src;
  }
  (this->super_QArrayDataPointer<QHeaderViewPrivate::SectionItem>).size = lVar3 - n;
  return;
}

Assistant:

void erase(T *b, qsizetype n)
    {
        T *e = b + n;
        Q_ASSERT(this->isMutable());
        Q_ASSERT(b < e);
        Q_ASSERT(b >= this->begin() && b < this->end());
        Q_ASSERT(e > this->begin() && e <= this->end());

        // Comply with std::vector::erase(): erased elements and all after them
        // are invalidated. However, erasing from the beginning effectively
        // means that all iterators are invalidated. We can use this freedom to
        // erase by moving towards the end.
        if (b == this->begin() && e != this->end()) {
            this->ptr = e;
        } else if (e != this->end()) {
            ::memmove(static_cast<void *>(b), static_cast<void *>(e),
                      (static_cast<T *>(this->end()) - e) * sizeof(T));
        }
        this->size -= n;
    }